

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O1

bool cmsys::SystemTools::MakeDirectory(string *path)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  int *piVar5;
  string dir;
  string topdir;
  string local_90;
  char *local_70;
  undefined8 local_68;
  char local_60;
  undefined7 uStack_5f;
  long *local_50 [2];
  long local_40 [2];
  
  if ((path->_M_string_length != 0) && (iVar3 = access((path->_M_dataplus)._M_p,4), iVar3 == 0)) {
    bVar2 = FileIsDirectory(path);
    return bVar2;
  }
  if (path->_M_string_length != 0) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    pcVar1 = (path->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar1,pcVar1 + path->_M_string_length);
    ConvertToUnixSlashes(&local_90);
    local_68 = 0;
    local_60 = '\0';
    local_70 = &local_60;
    lVar4 = std::__cxx11::string::find((char)&local_90,0x2f);
    if (lVar4 != -1) {
      do {
        std::__cxx11::string::substr((ulong)local_50,(ulong)&local_90);
        std::__cxx11::string::operator=((string *)&local_70,(string *)local_50);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
        mkdir(local_70,0x1ff);
        lVar4 = std::__cxx11::string::find((char)&local_90,0x2f);
      } while (lVar4 != -1);
    }
    std::__cxx11::string::_M_assign((string *)&local_70);
    iVar3 = mkdir(local_70,0x1ff);
    if ((iVar3 == 0) || (piVar5 = __errno_location(), *piVar5 == 0x11)) {
      bVar2 = true;
    }
    else {
      bVar2 = false;
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    return bVar2;
  }
  return false;
}

Assistant:

bool SystemTools::MakeDirectory(const kwsys_stl::string& path)
{
  if(SystemTools::FileExists(path))
    {
    return SystemTools::FileIsDirectory(path);
    }
  if(path.empty())
    {
    return false;
    }
  kwsys_stl::string dir = path;
  SystemTools::ConvertToUnixSlashes(dir);

  kwsys_stl::string::size_type pos = 0;
  kwsys_stl::string topdir;
  while((pos = dir.find('/', pos)) != kwsys_stl::string::npos)
    {
    topdir = dir.substr(0, pos);
    Mkdir(topdir);
    pos++;
    }
  topdir = dir;
  if(Mkdir(topdir) != 0)
    {
    // There is a bug in the Borland Run time library which makes MKDIR
    // return EACCES when it should return EEXISTS
    // if it is some other error besides directory exists
    // then return false
    if( (errno != EEXIST)
#ifdef __BORLANDC__
        && (errno != EACCES)
#endif
      )
      {
      return false;
      }
    }
  return true;
}